

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

int8_t __thiscall
icu_63::UnicodeString::caseCompare(UnicodeString *this,UnicodeString *text,uint32_t options)

{
  int8_t iVar1;
  int32_t thisLength;
  int32_t srcLength;
  uint32_t options_local;
  UnicodeString *text_local;
  UnicodeString *this_local;
  
  thisLength = length(this);
  srcLength = length(text);
  iVar1 = doCaseCompare(this,0,thisLength,text,0,srcLength,options);
  return iVar1;
}

Assistant:

inline int8_t
UnicodeString::caseCompare(const UnicodeString &text, uint32_t options) const {
  return doCaseCompare(0, length(), text, 0, text.length(), options);
}